

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O0

bool __thiscall re2::SparseSet::contains(SparseSet *this,int i)

{
  bool local_29;
  int i_local;
  SparseSet *this_local;
  
  if (i < 0) {
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_set.h"
                  ,0x80,"bool re2::SparseSet::contains(int) const");
  }
  if (i < this->max_size_) {
    if ((uint)i < (uint)this->max_size_) {
      local_29 = false;
      if ((uint)this->sparse_to_dense_[i] < (uint)this->size_) {
        local_29 = this->dense_[this->sparse_to_dense_[i]] == i;
      }
      this_local._7_1_ = local_29;
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("(i) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_set.h"
                ,0x81,"bool re2::SparseSet::contains(int) const");
}

Assistant:

bool contains(int i) const {
    DCHECK_GE(i, 0);
    DCHECK_LT(i, max_size_);
    if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
      return false;
    }
    // Unsigned comparison avoids checking sparse_to_dense_[i] < 0.
    return (uint)sparse_to_dense_[i] < (uint)size_ && 
      dense_[sparse_to_dense_[i]] == i;
  }